

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

iterator * __thiscall minibag::View::iterator::operator=(iterator *this,iterator *i)

{
  iterator *in_RSI;
  iterator *in_RDI;
  vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_> *in_stack_00000078;
  vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_> *in_stack_00000080;
  
  if (in_RDI != in_RSI) {
    in_RDI->view_ = in_RSI->view_;
    std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::operator=
              (in_stack_00000080,in_stack_00000078);
    in_RDI->view_revision_ = in_RSI->view_revision_;
    if (in_RDI->message_instance_ != (MessageInstance *)0x0) {
      if (in_RDI->message_instance_ != (MessageInstance *)0x0) {
        operator_delete(in_RDI->message_instance_,0x28);
      }
      in_RDI->message_instance_ = (MessageInstance *)0x0;
    }
  }
  return in_RDI;
}

Assistant:

View::iterator &View::iterator::operator=(iterator const& i) {
    if (this != &i) {
        view_ = i.view_;
        iters_ = i.iters_;
        view_revision_ = i.view_revision_;
        if (message_instance_ != NULL) {
            delete message_instance_;
            message_instance_ = NULL;
        }
    }
    return *this;
}